

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

Vec_Str_t * Abc_SclProduceGenlibStr(SC_Lib *p,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  SC_Cell *pRepr;
  undefined8 *puVar4;
  int Count_1;
  int iVar5;
  long lVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  char *pcVar9;
  int Count;
  SC_Cell *pSVar10;
  size_t sVar11;
  int i_4;
  long lVar12;
  SC_Lib *p_00;
  int iVar13;
  SC_Cell *pCell;
  void *pvVar14;
  int i;
  long lVar15;
  ulong uVar16;
  SC_Lib *__size;
  int iVar17;
  int i_2;
  size_t sVar18;
  SC_Lib *pSVar19;
  float fVar20;
  char Buffer [200];
  SC_Lib local_f8;
  
  lVar6 = (long)(p->vCellClasses).nSize;
  lVar15 = 0;
  iVar17 = 0;
  if (0 < lVar6) {
    lVar12 = 0;
    iVar17 = 0;
    do {
      pvVar3 = (p->vCellClasses).pArray[lVar12];
      if (*(int *)((long)pvVar3 + 0x44) == 1) {
        iVar13 = 0;
        pvVar14 = pvVar3;
        do {
          iVar13 = iVar13 + (uint)(*(int *)((long)pvVar14 + 0xc) == 0);
          pvVar14 = *(void **)((long)pvVar14 + 0x48);
        } while (pvVar14 != pvVar3);
        if (iVar17 <= iVar13) {
          iVar17 = iVar13;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar6);
  }
  iVar13 = 0;
  if (nGatesMin < iVar17) {
    iVar13 = nGatesMin;
  }
  Abc_SclMarkSkippedCells(p);
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar7->pArray = pcVar8;
  do {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar15];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar18 = 0x10;
      }
      else {
        sVar18 = (ulong)uVar2 * 2;
        if ((int)sVar18 <= (int)uVar2) goto LAB_003f1ea0;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar18);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar18;
    }
LAB_003f1ea0:
    iVar17 = pVVar7->nSize;
    pVVar7->nSize = iVar17 + 1;
    pVVar7->pArray[iVar17] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x28);
  lVar6 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar6];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar18 = 0x10;
      }
      else {
        sVar18 = (ulong)uVar2 * 2;
        if ((int)sVar18 <= (int)uVar2) goto LAB_003f1f2f;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar18);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar18;
    }
LAB_003f1f2f:
    iVar17 = pVVar7->nSize;
    pVVar7->nSize = iVar17 + 1;
    pVVar7->pArray[iVar17] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x28);
  if (nGatesMin == 0) {
    iVar13 = nGatesMin;
  }
  if ((p->vCellClasses).nSize < 1) {
    iVar17 = 2;
  }
  else {
    iVar17 = 2;
    lVar6 = 0;
    do {
      pRepr = (SC_Cell *)(p->vCellClasses).pArray[lVar6];
      if ((pRepr->n_inputs != 0) && (pRepr->n_outputs < 2)) {
        if ((iVar13 != 0) && (2 < pRepr->n_inputs)) {
          iVar5 = 0;
          pSVar10 = pRepr;
          do {
            iVar5 = iVar5 + (uint)(pSVar10->fSkip == 0);
            pSVar10 = pSVar10->pNext;
          } while (pSVar10 != pRepr);
          if (iVar5 < iVar13) goto LAB_003f27e2;
        }
        sVar18 = strlen(pRepr->pName);
        if (199 < sVar18) {
          __assert_fail("strlen(pRepr->pName) < 200",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                        ,0x37f,
                        "Vec_Str_t *Abc_SclProduceGenlibStr(SC_Lib *, float, float, int, int *)");
        }
        lVar15 = 0;
        do {
          cVar1 = "GATE "[lVar15];
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar18 = 0x10;
            }
            else {
              sVar18 = (ulong)uVar2 * 2;
              if ((int)sVar18 <= (int)uVar2) goto LAB_003f2046;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar18);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar18;
          }
LAB_003f2046:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = cVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 5);
        sprintf((char *)&local_f8,"%-16s",pRepr->pName);
        sVar18 = strlen((char *)&local_f8);
        if (0 < (int)(uint)sVar18) {
          uVar16 = 0;
          do {
            cVar1 = *(char *)((long)&local_f8.pName + uVar16);
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar11 = 0x10;
              }
              else {
                sVar11 = (ulong)uVar2 * 2;
                if ((int)sVar11 <= (int)uVar2) goto LAB_003f2104;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar11);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar11);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar11;
            }
LAB_003f2104:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            uVar16 = uVar16 + 1;
          } while (((uint)sVar18 & 0x7fffffff) != uVar16);
        }
        uVar2 = pVVar7->nCap;
        if (pVVar7->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            sVar18 = 0x10;
          }
          else {
            sVar18 = (ulong)uVar2 * 2;
            if ((int)sVar18 <= (int)uVar2) goto LAB_003f2184;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar18);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
            }
          }
          pVVar7->pArray = pcVar8;
          pVVar7->nCap = (int)sVar18;
        }
LAB_003f2184:
        iVar5 = pVVar7->nSize;
        pVVar7->nSize = iVar5 + 1;
        pVVar7->pArray[iVar5] = ' ';
        sprintf((char *)&local_f8,"%7.2f",(double)pRepr->area);
        sVar18 = strlen((char *)&local_f8);
        if (0 < (int)(uint)sVar18) {
          uVar16 = 0;
          do {
            cVar1 = *(char *)((long)&local_f8.pName + uVar16);
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar11 = 0x10;
              }
              else {
                sVar11 = (ulong)uVar2 * 2;
                if ((int)sVar11 <= (int)uVar2) goto LAB_003f222f;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar11);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar11);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar11;
            }
LAB_003f222f:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            uVar16 = uVar16 + 1;
          } while (((uint)sVar18 & 0x7fffffff) != uVar16);
        }
        uVar2 = pVVar7->nCap;
        if (pVVar7->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            sVar18 = 0x10;
          }
          else {
            sVar18 = (ulong)uVar2 * 2;
            if ((int)sVar18 <= (int)uVar2) goto LAB_003f22af;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar18);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
            }
          }
          pVVar7->pArray = pcVar8;
          pVVar7->nCap = (int)sVar18;
        }
LAB_003f22af:
        iVar5 = pVVar7->nSize;
        pVVar7->nSize = iVar5 + 1;
        pVVar7->pArray[iVar5] = ' ';
        iVar5 = pRepr->n_inputs;
        if (((long)iVar5 < 0) || ((pRepr->vPins).nSize <= iVar5)) goto LAB_003f2940;
        pcVar8 = *(pRepr->vPins).pArray[iVar5];
        sVar18 = strlen(pcVar8);
        if (0 < (int)(uint)sVar18) {
          uVar16 = 0;
          do {
            cVar1 = pcVar8[uVar16];
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar9 = (char *)malloc(0x10);
                }
                else {
                  pcVar9 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar11 = 0x10;
              }
              else {
                sVar11 = (ulong)uVar2 * 2;
                if ((int)sVar11 <= (int)uVar2) goto LAB_003f2361;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar9 = (char *)malloc(sVar11);
                }
                else {
                  pcVar9 = (char *)realloc(pVVar7->pArray,sVar11);
                }
              }
              pVVar7->pArray = pcVar9;
              pVVar7->nCap = (int)sVar11;
            }
LAB_003f2361:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            uVar16 = uVar16 + 1;
          } while (((uint)sVar18 & 0x7fffffff) != uVar16);
        }
        uVar2 = pVVar7->nCap;
        if (pVVar7->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            sVar18 = 0x10;
          }
          else {
            sVar18 = (ulong)uVar2 * 2;
            if ((int)sVar18 <= (int)uVar2) goto LAB_003f23e1;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar18);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
            }
          }
          pVVar7->pArray = pcVar8;
          pVVar7->nCap = (int)sVar18;
        }
LAB_003f23e1:
        iVar5 = pVVar7->nSize;
        pVVar7->nSize = iVar5 + 1;
        pVVar7->pArray[iVar5] = '=';
        iVar5 = pRepr->n_inputs;
        if (((long)iVar5 < 0) || ((pRepr->vPins).nSize <= iVar5)) {
LAB_003f2940:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pSVar19 = *(SC_Lib **)((long)(pRepr->vPins).pArray[iVar5] + 0x28);
        if (pSVar19 == (SC_Lib *)0x0) {
          pSVar19 = (SC_Lib *)0x902e00;
        }
        p_00 = pSVar19;
        sVar18 = strlen((char *)pSVar19);
        if (0 < (int)(uint)sVar18) {
          uVar16 = 0;
          do {
            cVar1 = *(char *)((long)&pSVar19->pName + uVar16);
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = (SC_Lib *)&DAT_00000010;
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,0x10);
                }
                __size = (SC_Lib *)&DAT_00000010;
              }
              else {
                __size = (SC_Lib *)((ulong)uVar2 * 2);
                if ((int)__size <= (int)uVar2) goto LAB_003f24a3;
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = __size;
                  pcVar8 = (char *)malloc((size_t)__size);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,(size_t)__size);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)__size;
            }
LAB_003f24a3:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            uVar16 = uVar16 + 1;
          } while (((uint)sVar18 & 0x7fffffff) != uVar16);
        }
        lVar15 = 0;
        do {
          cVar1 = " ) ;\n"[lVar15 + 3];
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              p_00 = (SC_Lib *)pVVar7->pArray;
              if (p_00 == (SC_Lib *)0x0) {
                p_00 = (SC_Lib *)&DAT_00000010;
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(p_00,0x10);
              }
              pSVar19 = (SC_Lib *)&DAT_00000010;
            }
            else {
              pSVar19 = (SC_Lib *)((ulong)uVar2 * 2);
              if ((int)pSVar19 <= (int)uVar2) goto LAB_003f252c;
              p_00 = (SC_Lib *)pVVar7->pArray;
              if (p_00 == (SC_Lib *)0x0) {
                p_00 = pSVar19;
                pcVar8 = (char *)malloc((size_t)pSVar19);
              }
              else {
                pcVar8 = (char *)realloc(p_00,(size_t)pSVar19);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)pSVar19;
          }
LAB_003f252c:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = cVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 2);
        if (0 < pRepr->n_inputs) {
          lVar15 = 0;
          do {
            if ((pRepr->vPins).nSize <= lVar15) goto LAB_003f2940;
            puVar4 = (undefined8 *)(pRepr->vPins).pArray[lVar15];
            fVar20 = Abc_SclComputeDelayClassPin(p_00,pRepr,(int)lVar15,Slew,Gain);
            if (fVar20 <= 0.0) {
              __assert_fail("Delay > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                            ,0x38f,
                            "Vec_Str_t *Abc_SclProduceGenlibStr(SC_Lib *, float, float, int, int *)"
                           );
            }
            lVar12 = 0;
            do {
              cVar1 = "         PIN "[lVar12];
              uVar2 = pVVar7->nCap;
              if (pVVar7->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar18 = 0x10;
                }
                else {
                  sVar18 = (ulong)uVar2 * 2;
                  if ((int)sVar18 <= (int)uVar2) goto LAB_003f260c;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar18);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar18;
              }
LAB_003f260c:
              iVar5 = pVVar7->nSize;
              pVVar7->nSize = iVar5 + 1;
              pVVar7->pArray[iVar5] = cVar1;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0xd);
            sprintf((char *)&local_f8,"%-4s",*puVar4);
            sVar18 = strlen((char *)&local_f8);
            if (0 < (int)(uint)sVar18) {
              uVar16 = 0;
              do {
                cVar1 = *(char *)((long)&local_f8.pName + uVar16);
                uVar2 = pVVar7->nCap;
                if (pVVar7->nSize == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar11 = 0x10;
                  }
                  else {
                    sVar11 = (ulong)uVar2 * 2;
                    if ((int)sVar11 <= (int)uVar2) goto LAB_003f26c7;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar11);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar11);
                    }
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar11;
                }
LAB_003f26c7:
                iVar5 = pVVar7->nSize;
                pVVar7->nSize = iVar5 + 1;
                pVVar7->pArray[iVar5] = cVar1;
                uVar16 = uVar16 + 1;
              } while (((uint)sVar18 & 0x7fffffff) != uVar16);
            }
            p_00 = &local_f8;
            sprintf((char *)p_00," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar20,
                    SUB84((double)fVar20,0));
            sVar18 = strlen((char *)p_00);
            if (0 < (int)(uint)sVar18) {
              uVar16 = 0;
              do {
                cVar1 = *(char *)((long)&local_f8.pName + uVar16);
                uVar2 = pVVar7->nCap;
                if (pVVar7->nSize == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    p_00 = (SC_Lib *)pVVar7->pArray;
                    if (p_00 == (SC_Lib *)0x0) {
                      p_00 = (SC_Lib *)&DAT_00000010;
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(p_00,0x10);
                    }
                    pSVar19 = (SC_Lib *)&DAT_00000010;
                  }
                  else {
                    pSVar19 = (SC_Lib *)((ulong)uVar2 * 2);
                    if ((int)pSVar19 <= (int)uVar2) goto LAB_003f2789;
                    p_00 = (SC_Lib *)pVVar7->pArray;
                    if (p_00 == (SC_Lib *)0x0) {
                      p_00 = pSVar19;
                      pcVar8 = (char *)malloc((size_t)pSVar19);
                    }
                    else {
                      pcVar8 = (char *)realloc(p_00,(size_t)pSVar19);
                    }
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)pSVar19;
                }
LAB_003f2789:
                iVar5 = pVVar7->nSize;
                pVVar7->nSize = iVar5 + 1;
                pVVar7->pArray[iVar5] = cVar1;
                uVar16 = uVar16 + 1;
              } while (((uint)sVar18 & 0x7fffffff) != uVar16);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pRepr->n_inputs);
        }
        iVar17 = iVar17 + 1;
      }
LAB_003f27e2:
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vCellClasses).nSize);
  }
  lVar6 = 0;
  do {
    cVar1 = "\n.end\n"[lVar6];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar18 = 0x10;
      }
      else {
        sVar18 = (ulong)uVar2 * 2;
        if ((int)sVar18 <= (int)uVar2) goto LAB_003f2884;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar18);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar18;
    }
LAB_003f2884:
    iVar13 = pVVar7->nSize;
    pVVar7->nSize = iVar13 + 1;
    pVVar7->pArray[iVar13] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar2 = pVVar7->nCap;
  if (pVVar7->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
      }
      sVar18 = 0x10;
    }
    else {
      sVar18 = (ulong)uVar2 * 2;
      if ((int)sVar18 <= (int)uVar2) goto LAB_003f2901;
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar18);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,sVar18);
      }
    }
    pVVar7->pArray = pcVar8;
    pVVar7->nCap = (int)sVar18;
  }
LAB_003f2901:
  iVar13 = pVVar7->nSize;
  pVVar7->nSize = iVar13 + 1;
  pVVar7->pArray[iVar13] = '\0';
  if (pnCellCount != (int *)0x0) {
    *pnCellCount = iVar17;
  }
  return pVVar7;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStr( SC_Lib * p, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCellClass( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}